

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O0

void __thiscall phmap::priv::anon_unknown_0::BitMask_Smoke_Test::TestBody(BitMask_Smoke_Test *this)

{
  ElementsAreMatcher<std::tuple<int,_int>_> matcher;
  ElementsAreMatcher<std::tuple<int,_int>_> matcher_00;
  ElementsAreMatcher<std::tuple<int,_int,_int,_int>_> matcher_01;
  ElementsAreMatcher<std::tuple<int,_int,_int,_int>_> matcher_02;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  _Head_base<1UL,_int,_false> in_stack_fffffffffffffd20;
  _Head_base<0UL,_int,_false> in_stack_fffffffffffffd24;
  undefined8 in_stack_fffffffffffffd28;
  AssertHelper local_298;
  Message local_290;
  BitMask<unsigned_char,_8,_0> local_281;
  int local_280 [4];
  testing local_270 [8];
  _Tuple_impl<2UL,_int,_int> local_268;
  char local_260 [16];
  undefined1 local_250 [8];
  AssertionResult gtest_ar_7;
  Message local_238;
  BitMask<unsigned_char,_8,_0> local_229;
  int local_228 [4];
  testing local_218 [8];
  _Tuple_impl<2UL,_int,_int> local_210;
  char local_208 [16];
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_6;
  Message local_1e0;
  BitMask<unsigned_char,_8,_0> local_1d1;
  int local_1d0 [2];
  testing local_1c8 [8];
  char local_1c0 [8];
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_5;
  Message local_1a0;
  BitMask<unsigned_char,_8,_0> local_195;
  int local_194;
  testing local_190 [4];
  char local_18c [4];
  undefined1 local_188 [8];
  AssertionResult gtest_ar_4;
  Message local_170;
  BitMask<unsigned_char,_8,_0> local_161;
  int local_160 [2];
  testing local_158 [8];
  char local_150 [8];
  undefined1 local_148 [8];
  AssertionResult gtest_ar_3;
  Message local_130;
  BitMask<unsigned_char,_8,_0> local_125;
  int local_124;
  testing local_120 [4];
  char local_11c [4];
  undefined1 local_118 [8];
  AssertionResult gtest_ar_2;
  Message local_100;
  BitMask<unsigned_char,_8,_0> local_f5;
  int local_f4;
  testing local_f0 [4];
  char local_ec [4];
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_1;
  Message local_d0;
  BitMask<unsigned_char,_8,_0> local_c5 [4];
  char local_c1;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_90;
  Message local_88;
  BitMask<unsigned_char,_8,_0> local_79;
  undefined1 local_78 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_48 [3];
  Message local_30;
  BitMask<unsigned_char,_8,_0> local_22;
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  BitMask_Smoke_Test *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  BitMask<unsigned_char,_8,_0>::BitMask(&local_22,'\0');
  bVar1 = BitMask::operator_cast_to_bool((BitMask *)&local_22);
  local_21 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_20,
               (AssertionResult *)"(BitMask<uint8_t, 8>(0))","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x75,pcVar2);
    testing::internal::AssertHelper::operator=(local_48,&local_30);
    testing::internal::AssertHelper::~AssertHelper(local_48);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  BitMask<unsigned_char,_8,_0>::BitMask(&local_79,'\x05');
  testing::AssertionResult::AssertionResult<phmap::priv::BitMask<unsigned_char,8,0>>
            ((AssertionResult *)local_78,&local_79,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_78,
               (AssertionResult *)"(BitMask<uint8_t, 8>(5))","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x76,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  testing::ElementsAre<>();
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<>>>();
  BitMask<unsigned_char,_8,_0>::BitMask(local_c5,'\0');
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<>>>::operator()
            (local_c0,&local_c1,(BitMask<unsigned_char,_8,_0> *)"(BitMask<uint8_t, 8>(0))");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x78,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_f4 = 0;
  testing::ElementsAre<int>(local_f0,&local_f4);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int>>>
            ((ElementsAreMatcher<std::tuple<int>_>)in_stack_fffffffffffffd20._M_head_impl);
  BitMask<unsigned_char,_8,_0>::BitMask(&local_f5,'\x01');
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int>>>::operator()
            (local_e8,local_ec,(BitMask<unsigned_char,_8,_0> *)"(BitMask<uint8_t, 8>(0x1))");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x79,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  local_124 = 1;
  testing::ElementsAre<int>(local_120,&local_124);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int>>>
            ((ElementsAreMatcher<std::tuple<int>_>)in_stack_fffffffffffffd20._M_head_impl);
  BitMask<unsigned_char,_8,_0>::BitMask(&local_125,'\x02');
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int>>>::operator()
            (local_118,local_11c,(BitMask<unsigned_char,_8,_0> *)"(BitMask<uint8_t, 8>(0x2))");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x7a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  local_160[1] = 0;
  local_160[0] = 1;
  testing::ElementsAre<int,int>(local_158,local_160 + 1,local_160);
  matcher.matchers_.super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl
       = in_stack_fffffffffffffd24._M_head_impl;
  matcher.matchers_.super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl =
       (_Head_base<1UL,_int,_false>)
       (_Head_base<1UL,_int,_false>)in_stack_fffffffffffffd20._M_head_impl;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int>>>
            (matcher);
  BitMask<unsigned_char,_8,_0>::BitMask(&local_161,'\x03');
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int>>>::
  operator()(local_148,local_150,(BitMask<unsigned_char,_8,_0> *)"(BitMask<uint8_t, 8>(0x3))");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x7b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  local_194 = 2;
  testing::ElementsAre<int>(local_190,&local_194);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int>>>
            ((ElementsAreMatcher<std::tuple<int>_>)in_stack_fffffffffffffd20._M_head_impl);
  BitMask<unsigned_char,_8,_0>::BitMask(&local_195,'\x04');
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int>>>::operator()
            (local_188,local_18c,(BitMask<unsigned_char,_8,_0> *)"(BitMask<uint8_t, 8>(0x4))");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x7c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  local_1d0[1] = 0;
  local_1d0[0] = 2;
  testing::ElementsAre<int,int>(local_1c8,local_1d0 + 1,local_1d0);
  matcher_00.matchers_.super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>.
  _M_head_impl = in_stack_fffffffffffffd24._M_head_impl;
  matcher_00.matchers_.super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl =
       (_Head_base<1UL,_int,_false>)
       (_Head_base<1UL,_int,_false>)in_stack_fffffffffffffd20._M_head_impl;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int>>>
            (matcher_00);
  BitMask<unsigned_char,_8,_0>::BitMask(&local_1d1,'\x05');
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int>>>::
  operator()(local_1b8,local_1c0,(BitMask<unsigned_char,_8,_0> *)"(BitMask<uint8_t, 8>(0x5))");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x7d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  local_228[3] = 0;
  local_228[2] = 2;
  local_228[1] = 4;
  local_228[0] = 6;
  testing::ElementsAre<int,int,int,int>
            (local_218,local_228 + 3,local_228 + 2,local_228 + 1,local_228);
  matcher_01.matchers_.super__Tuple_impl<0UL,_int,_int,_int,_int>.
  super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
       (int)in_stack_fffffffffffffd28;
  matcher_01.matchers_.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
  _M_head_impl = (int)((ulong)in_stack_fffffffffffffd28 >> 0x20);
  matcher_01.matchers_.super__Tuple_impl<0UL,_int,_int,_int,_int>.
  super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> = local_210;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int,int,int>>>
            (matcher_01);
  BitMask<unsigned_char,_8,_0>::BitMask(&local_229,'U');
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int,int,int>>>
  ::operator()(local_1f8,local_208,(BitMask<unsigned_char,_8,_0> *)"(BitMask<uint8_t, 8>(0x55))");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x7e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  local_280[3] = 1;
  local_280[2] = 3;
  local_280[1] = 5;
  local_280[0] = 7;
  testing::ElementsAre<int,int,int,int>
            (local_270,local_280 + 3,local_280 + 2,local_280 + 1,local_280);
  matcher_02.matchers_.super__Tuple_impl<0UL,_int,_int,_int,_int>.
  super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
       (int)in_stack_fffffffffffffd28;
  matcher_02.matchers_.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
  _M_head_impl = (int)((ulong)in_stack_fffffffffffffd28 >> 0x20);
  matcher_02.matchers_.super__Tuple_impl<0UL,_int,_int,_int,_int>.
  super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> = local_268;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int,int,int>>>
            (matcher_02);
  BitMask<unsigned_char,_8,_0>::BitMask(&local_281,0xaa);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int,int,int>>>
  ::operator()(local_250,local_260,(BitMask<unsigned_char,_8,_0> *)"(BitMask<uint8_t, 8>(0xAA))");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(&local_290);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
    testing::internal::AssertHelper::AssertHelper
              (&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x7f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_298,&local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_298);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  return;
}

Assistant:

TEST(BitMask, Smoke) {
  EXPECT_FALSE((BitMask<uint8_t, 8>(0)));
  EXPECT_TRUE((BitMask<uint8_t, 8>(5)));

  EXPECT_THAT((BitMask<uint8_t, 8>(0)), ElementsAre());
  EXPECT_THAT((BitMask<uint8_t, 8>(0x1)), ElementsAre(0));
  EXPECT_THAT((BitMask<uint8_t, 8>(0x2)), ElementsAre(1));
  EXPECT_THAT((BitMask<uint8_t, 8>(0x3)), ElementsAre(0, 1));
  EXPECT_THAT((BitMask<uint8_t, 8>(0x4)), ElementsAre(2));
  EXPECT_THAT((BitMask<uint8_t, 8>(0x5)), ElementsAre(0, 2));
  EXPECT_THAT((BitMask<uint8_t, 8>(0x55)), ElementsAre(0, 2, 4, 6));
  EXPECT_THAT((BitMask<uint8_t, 8>(0xAA)), ElementsAre(1, 3, 5, 7));
}